

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O0

Aig_Man_t *
Fra_FraigLatchCorrespondence
          (Aig_Man_t *pAig,int nFramesP,int nConfMax,int fProve,int fVerbose,int *pnIter,
          float TimeLimit)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  abctime aVar6;
  abctime aVar7;
  Fra_Sml_t *p_00;
  abctime aVar8;
  Abc_Cex_t *pAVar9;
  Fra_Lcr_t *pLcr;
  Fra_Man_t *p_01;
  Fra_Cla_t *pFVar10;
  Aig_Man_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  Vec_Int_t *vPart_00;
  abctime aVar13;
  Aig_Man_t *Entry;
  float local_ac;
  abctime TimeToStop;
  abctime clk;
  abctime clk3;
  abctime clk2;
  abctime timeSim;
  int nIter;
  int i;
  Vec_Int_t *vPart;
  Aig_Man_t *pAigNew;
  Aig_Man_t *pAigTemp;
  Aig_Man_t *pAigPart;
  Fra_Man_t *pTemp;
  Fra_Sml_t *pSml;
  Fra_Lcr_t *p;
  int fReprSelect;
  int nPartSize;
  float TimeLimit_local;
  int *pnIter_local;
  int fVerbose_local;
  int fProve_local;
  int nConfMax_local;
  int nFramesP_local;
  Aig_Man_t *pAig_local;
  
  vPart = (Vec_Int_t *)0x0;
  aVar6 = Abc_Clock();
  if ((TimeLimit != 0.0) || (NAN(TimeLimit))) {
    aVar7 = Abc_Clock();
    local_ac = TimeLimit * 1e+06 + (float)aVar7;
  }
  else {
    local_ac = 0.0;
  }
  iVar1 = Aig_ManNodeNum(pAig);
  if (iVar1 == 0) {
    if (pnIter != (int *)0x0) {
      *pnIter = 0;
    }
    iVar1 = Aig_ManObjNumMax(pAig);
    Aig_ManReprStart(pAig,iVar1);
    pAig_local = Aig_ManDupOrdered(pAig);
  }
  else {
    iVar1 = Aig_ManRegNum(pAig);
    if (iVar1 < 1) {
      __assert_fail("Aig_ManRegNum(pAig) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraLcr.c"
                    ,0x226,
                    "Aig_Man_t *Fra_FraigLatchCorrespondence(Aig_Man_t *, int, int, int, int, int *, float)"
                   );
    }
    aVar7 = Abc_Clock();
    if (fVerbose != 0) {
      uVar2 = Aig_ManNodeNum(pAig);
      printf("Simulating AIG with %d nodes for %d cycles ...  ",(ulong)uVar2,
             (ulong)(nFramesP + 0x20));
    }
    p_00 = Fra_SmlSimulateSeq(pAig,nFramesP,0x20,1,1);
    if (fVerbose != 0) {
      Abc_Print(1,"%s =","Time");
      aVar8 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar7) * 1.0) / 1000000.0);
    }
    aVar8 = Abc_Clock();
    if ((fProve == 0) || (p_00->fNonConstOut == 0)) {
      pLcr = Lcr_ManAlloc(pAig);
      pLcr->nFramesP = nFramesP;
      pLcr->fVerbose = fVerbose;
      pLcr->timeSim = (aVar8 - aVar7) + pLcr->timeSim;
      p_01 = Fra_LcrAigPrepare(pAig);
      p_01->pBmc = (Fra_Bmc_t *)pLcr;
      p_01->pSml = p_00;
      pFVar10 = Fra_ClassesStart(pLcr->pAig);
      pLcr->pCla = pFVar10;
      p_01->pCla = pFVar10;
      Fra_ClassesPrepare(pLcr->pCla,1,0);
      pLcr->pCla->pFuncNodeIsConst = Fra_LcrNodeIsConst;
      pLcr->pCla->pFuncNodesAreEqual = Fra_LcrNodesAreEqual;
      Fra_SmlStop(p_01->pSml);
      aVar7 = Abc_Clock();
      if (fVerbose != 0) {
        printf("Partitioning AIG ...  ");
      }
      pAVar11 = Fra_LcrDeriveAigForPartitioning(pLcr);
      pVVar12 = Aig_ManPartitionSmart(pAVar11,200,0,(Vec_Ptr_t **)0x0);
      pLcr->vParts = pVVar12;
      Fra_LcrRemapPartitions(pLcr->vParts,pLcr->pCla,pLcr->pInToOutPart,pLcr->pInToOutNum);
      Aig_ManStop(pAVar11);
      if (fVerbose != 0) {
        Abc_Print(1,"%s =","Time");
        aVar8 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar7) * 1.0) / 1000000.0);
        aVar8 = Abc_Clock();
        pLcr->timePart = (aVar8 - aVar7) + pLcr->timePart;
      }
      iVar1 = Fra_ClassesCountLits(pLcr->pCla);
      pLcr->nLitsBeg = iVar1;
      iVar1 = Aig_ManNodeNum(pLcr->pAig);
      pLcr->nNodesBeg = iVar1;
      iVar1 = Aig_ManRegNum(pLcr->pAig);
      pLcr->nRegsBeg = iVar1;
      pLcr->fRefining = 1;
      timeSim._0_4_ = 0;
      while (pLcr->fRefining != 0) {
        pLcr->fRefining = 0;
        aVar7 = Abc_Clock();
        Fra_ClassNodesMark(pLcr);
        Vec_PtrClear(pLcr->vFraigs);
        timeSim._4_4_ = 0;
LAB_007a09cb:
        iVar1 = Vec_PtrSize(pLcr->vParts);
        if (timeSim._4_4_ < iVar1) {
          vPart_00 = (Vec_Int_t *)Vec_PtrEntry(pLcr->vParts,timeSim._4_4_);
          if (((TimeLimit == 0.0) && (!NAN(TimeLimit))) ||
             (aVar8 = Abc_Clock(), aVar8 <= (long)local_ac)) goto LAB_007a0add;
          for (timeSim._4_4_ = 0; iVar1 = Vec_PtrSize(pLcr->vFraigs), timeSim._4_4_ < iVar1;
              timeSim._4_4_ = timeSim._4_4_ + 1) {
            pAVar11 = (Aig_Man_t *)Vec_PtrEntry(pLcr->vFraigs,timeSim._4_4_);
            Aig_ManStop(pAVar11);
          }
          Aig_ManCleanMarkA(pAig);
          Aig_ManCleanMarkB(pAig);
          printf("Fra_FraigLatchCorrespondence(): Runtime limit exceeded.\n");
          goto LAB_007a0e7b;
        }
        Fra_ClassNodesUnmark(pLcr);
        if (fVerbose != 0) {
          uVar2 = Vec_PtrSize(pLcr->pCla->vClasses1);
          uVar3 = Vec_PtrSize(pLcr->pCla->vClasses);
          uVar4 = Fra_ClassesCountLits(pLcr->pCla);
          uVar5 = Vec_PtrSize(pLcr->vParts);
          printf("%3d : Const = %6d. Class = %6d.  L = %6d. Part = %3d.  ",(ulong)(uint)timeSim,
                 (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
          Abc_Print(1,"%s =","T");
          aVar8 = Abc_Clock();
          Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar7) * 1.0) / 1000000.0);
        }
        Fra_LcrAigPrepareTwo(pLcr->pAig,p_01);
        iVar1 = Fra_ClassesRefine(pLcr->pCla);
        if (iVar1 != 0) {
          pLcr->fRefining = 1;
        }
        iVar1 = Fra_ClassesRefine1(pLcr->pCla,0,(int *)0x0);
        if (iVar1 != 0) {
          pLcr->fRefining = 1;
        }
        for (timeSim._4_4_ = 0; iVar1 = Vec_PtrSize(pLcr->vFraigs), timeSim._4_4_ < iVar1;
            timeSim._4_4_ = timeSim._4_4_ + 1) {
          pAVar11 = (Aig_Man_t *)Vec_PtrEntry(pLcr->vFraigs,timeSim._4_4_);
          Aig_ManStop(pAVar11);
        }
        aVar7 = Abc_Clock();
        Vec_VecFree((Vec_Vec_t *)pLcr->vParts);
        pAVar11 = Fra_LcrDeriveAigForPartitioning(pLcr);
        pVVar12 = Aig_ManPartitionSmart(pAVar11,200,0,(Vec_Ptr_t **)0x0);
        pLcr->vParts = pVVar12;
        Fra_LcrRemapPartitions(pLcr->vParts,pLcr->pCla,pLcr->pInToOutPart,pLcr->pInToOutNum);
        Aig_ManStop(pAVar11);
        aVar8 = Abc_Clock();
        pLcr->timePart = (aVar8 - aVar7) + pLcr->timePart;
        timeSim._0_4_ = (uint)timeSim + 1;
      }
      pLcr->nIters = (uint)timeSim;
      aVar7 = Abc_Clock();
      Fra_ClassesCopyReprs(pLcr->pCla,(Vec_Ptr_t *)0x0);
      vPart = (Vec_Int_t *)Aig_ManDupRepr(pLcr->pAig,0);
      Aig_ManSeqCleanup((Aig_Man_t *)vPart);
      aVar8 = Abc_Clock();
      pLcr->timeUpdate = (aVar8 - aVar7) + pLcr->timeUpdate;
      aVar7 = Abc_Clock();
      pLcr->timeTotal = aVar7 - aVar6;
      iVar1 = Fra_ClassesCountLits(pLcr->pCla);
      pLcr->nLitsEnd = iVar1;
      iVar1 = Aig_ManNodeNum((Aig_Man_t *)vPart);
      pLcr->nNodesEnd = iVar1;
      iVar1 = Aig_ManRegNum((Aig_Man_t *)vPart);
      pLcr->nRegsEnd = iVar1;
LAB_007a0e7b:
      if (p_01 != (Fra_Man_t *)0x0) {
        free(p_01);
      }
      Lcr_ManFree(pLcr);
      if (pnIter != (int *)0x0) {
        *pnIter = (uint)timeSim;
      }
      pAig_local = (Aig_Man_t *)vPart;
    }
    else {
      pAVar9 = Fra_SmlGetCounterExample(p_00);
      pAig->pSeqModel = pAVar9;
      Fra_SmlStop(p_00);
      pAig_local = (Aig_Man_t *)0x0;
    }
  }
  return pAig_local;
LAB_007a0add:
  aVar8 = Abc_Clock();
  pAVar11 = Fra_LcrCreatePart(pLcr,vPart_00);
  aVar13 = Abc_Clock();
  pLcr->timeTrav = (aVar13 - aVar8) + pLcr->timeTrav;
  aVar8 = Abc_Clock();
  Entry = Fra_FraigEquivence(pAVar11,nConfMax,0);
  aVar13 = Abc_Clock();
  pLcr->timeFraig = (aVar13 - aVar8) + pLcr->timeFraig;
  Vec_PtrPush(pLcr->vFraigs,Entry);
  Aig_ManStop(pAVar11);
  timeSim._4_4_ = timeSim._4_4_ + 1;
  goto LAB_007a09cb;
}

Assistant:

Aig_Man_t * Fra_FraigLatchCorrespondence( Aig_Man_t * pAig, int nFramesP, int nConfMax, int fProve, int fVerbose, int * pnIter, float TimeLimit )
{
    int nPartSize    = 200;
    int fReprSelect  = 0;
    Fra_Lcr_t * p;
    Fra_Sml_t * pSml;
    Fra_Man_t * pTemp;
    Aig_Man_t * pAigPart, * pAigTemp, * pAigNew = NULL;
    Vec_Int_t * vPart;
    int i, nIter;
    abctime timeSim, clk2, clk3, clk = Abc_Clock();
    abctime TimeToStop = TimeLimit ? TimeLimit * CLOCKS_PER_SEC + Abc_Clock() : 0;
    if ( Aig_ManNodeNum(pAig) == 0 )
    {
        if ( pnIter ) *pnIter = 0;
        // Ntl_ManFinalize() requires the following to satisfy an assertion.
        Aig_ManReprStart(pAig,Aig_ManObjNumMax(pAig));
        return Aig_ManDupOrdered(pAig);
    }
    assert( Aig_ManRegNum(pAig) > 0 ); 

    // simulate the AIG 
clk2 = Abc_Clock();
if ( fVerbose )
printf( "Simulating AIG with %d nodes for %d cycles ...  ", Aig_ManNodeNum(pAig), nFramesP + 32 );
    pSml = Fra_SmlSimulateSeq( pAig, nFramesP, 32, 1, 1  ); 
if ( fVerbose ) 
{
ABC_PRT( "Time", Abc_Clock() - clk2 );
}
timeSim = Abc_Clock() - clk2;

    // check if simulation discovered non-constant-0 POs
    if ( fProve && pSml->fNonConstOut )
    {
        pAig->pSeqModel = Fra_SmlGetCounterExample( pSml );
        Fra_SmlStop( pSml );
        return NULL;
    }

    // start the manager
    p = Lcr_ManAlloc( pAig );
    p->nFramesP = nFramesP;
    p->fVerbose = fVerbose;
    p->timeSim += timeSim;

    pTemp = Fra_LcrAigPrepare( pAig );
    pTemp->pBmc = (Fra_Bmc_t *)p;
    pTemp->pSml = pSml;

    // get preliminary info about equivalence classes
    pTemp->pCla = p->pCla = Fra_ClassesStart( p->pAig );
    Fra_ClassesPrepare( p->pCla, 1, 0 );
    p->pCla->pFuncNodeIsConst   = Fra_LcrNodeIsConst;
    p->pCla->pFuncNodesAreEqual = Fra_LcrNodesAreEqual;
    Fra_SmlStop( pTemp->pSml );

    // partition the AIG for latch correspondence computation
clk2 = Abc_Clock();
if ( fVerbose )
printf( "Partitioning AIG ...  " );
    pAigPart = Fra_LcrDeriveAigForPartitioning( p );
    p->vParts = (Vec_Ptr_t *)Aig_ManPartitionSmart( pAigPart, nPartSize, 0, NULL );
    Fra_LcrRemapPartitions( p->vParts, p->pCla, p->pInToOutPart, p->pInToOutNum );
    Aig_ManStop( pAigPart );
if ( fVerbose ) 
{
ABC_PRT( "Time", Abc_Clock() - clk2 );
p->timePart += Abc_Clock() - clk2;
}

    // get the initial stats
    p->nLitsBeg  = Fra_ClassesCountLits( p->pCla );
    p->nNodesBeg = Aig_ManNodeNum(p->pAig);
    p->nRegsBeg  = Aig_ManRegNum(p->pAig);

    // perforn interative reduction of the partitions
    p->fRefining = 1;
    for ( nIter = 0; p->fRefining; nIter++ )
    {
        p->fRefining = 0;
        clk3 = Abc_Clock();
        // derive AIGs for each partition
        Fra_ClassNodesMark( p );
        Vec_PtrClear( p->vFraigs );
        Vec_PtrForEachEntry( Vec_Int_t *, p->vParts, vPart, i )
        {
            if ( TimeLimit != 0.0 && Abc_Clock() > TimeToStop )
            {
                Vec_PtrForEachEntry( Aig_Man_t *, p->vFraigs, pAigPart, i )
                    Aig_ManStop( pAigPart );
                Aig_ManCleanMarkA( pAig );
                Aig_ManCleanMarkB( pAig );
                printf( "Fra_FraigLatchCorrespondence(): Runtime limit exceeded.\n" );
                goto finish;
            }
clk2 = Abc_Clock();
            pAigPart = Fra_LcrCreatePart( p, vPart );
p->timeTrav += Abc_Clock() - clk2;
clk2 = Abc_Clock();
            pAigTemp  = Fra_FraigEquivence( pAigPart, nConfMax, 0 );
p->timeFraig += Abc_Clock() - clk2;
            Vec_PtrPush( p->vFraigs, pAigTemp );
/*
            {
                char Name[1000];
                sprintf( Name, "part%04d.blif", i );
                Aig_ManDumpBlif( pAigPart, Name, NULL, NULL );
            }
printf( "Finished part %4d (out of %4d).  ", i, Vec_PtrSize(p->vParts) );
ABC_PRT( "Time", Abc_Clock() - clk3 );
*/

            Aig_ManStop( pAigPart );
        }
        Fra_ClassNodesUnmark( p );
        // report the intermediate results
        if ( fVerbose )
        {
            printf( "%3d : Const = %6d. Class = %6d.  L = %6d. Part = %3d.  ", 
                nIter, Vec_PtrSize(p->pCla->vClasses1), Vec_PtrSize(p->pCla->vClasses), 
                Fra_ClassesCountLits(p->pCla), Vec_PtrSize(p->vParts) );
            ABC_PRT( "T", Abc_Clock() - clk3 );
        }
        // refine the classes
        Fra_LcrAigPrepareTwo( p->pAig, pTemp );
        if ( Fra_ClassesRefine( p->pCla ) )
            p->fRefining = 1;
        if ( Fra_ClassesRefine1( p->pCla, 0, NULL ) )
            p->fRefining = 1;
        // clean the fraigs
        Vec_PtrForEachEntry( Aig_Man_t *, p->vFraigs, pAigPart, i )
            Aig_ManStop( pAigPart );

        // repartition if needed
        if ( 1 )
        {
clk2 = Abc_Clock();
            Vec_VecFree( (Vec_Vec_t *)p->vParts );
            pAigPart = Fra_LcrDeriveAigForPartitioning( p );
            p->vParts = (Vec_Ptr_t *)Aig_ManPartitionSmart( pAigPart, nPartSize, 0, NULL );
            Fra_LcrRemapPartitions( p->vParts, p->pCla, p->pInToOutPart, p->pInToOutNum );
            Aig_ManStop( pAigPart );
p->timePart += Abc_Clock() - clk2;
        }
    }
    p->nIters = nIter;

    // move the classes into representatives and reduce AIG
clk2 = Abc_Clock();
//    Fra_ClassesPrint( p->pCla, 1 );
    if ( fReprSelect )
        Fra_ClassesSelectRepr( p->pCla );
    Fra_ClassesCopyReprs( p->pCla, NULL );
    pAigNew = Aig_ManDupRepr( p->pAig, 0 );
    Aig_ManSeqCleanup( pAigNew );
//    Aig_ManCountMergeRegs( pAigNew );
p->timeUpdate += Abc_Clock() - clk2;
p->timeTotal = Abc_Clock() - clk;
    // get the final stats
    p->nLitsEnd  = Fra_ClassesCountLits( p->pCla );
    p->nNodesEnd = Aig_ManNodeNum(pAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pAigNew);
finish:
    ABC_FREE( pTemp );
    Lcr_ManFree( p );
    if ( pnIter ) *pnIter = nIter;
    return pAigNew;
}